

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

void __thiscall
tchecker::zg::path::concrete::node_t::node_t
          (node_t *this,state_sptr_t *s,clockval_sptr_t *clockval,bool initial,bool final)

{
  const_clockval_sptr_t *this_00;
  ushort uVar1;
  bool bVar2;
  make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *pmVar3;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *pmVar4;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar5;
  zone_t *this_01;
  clockval_t *clockval_00;
  invalid_argument *this_02;
  
  symbolic::node_t::node_t(&this->super_node_t,s,initial,final);
  this_00 = &this->_clockval;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>::
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>>
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>
              *)this_00,clockval);
  pmVar3 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
           ::operator->(this_00);
  uVar1 = (pmVar3->super_clockval_t).super_clock_value_array_t.super_clockval_base_t.
          super_array_capacity_t<unsigned_short>._capacity;
  pmVar4 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->(s);
  pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
           ::operator*(&(pmVar4->super_state_t)._zone);
  if ((pmVar5->super_zone_t)._dim == (uint)uVar1) {
    pmVar4 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
             ::operator->(s);
    this_01 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
               ::operator*(&(pmVar4->super_state_t)._zone)->super_zone_t;
    clockval_00 = &intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
                   ::operator*(this_00)->super_clockval_t;
    bVar2 = zone_t::belongs(this_01,clockval_00);
    if (bVar2) {
      return;
    }
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_02,"clock valuation does not belong to the zone");
  }
  else {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_02,"clock values and zone do not have the same size");
  }
  __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

node_t::node_t(tchecker::zg::state_sptr_t const & s, tchecker::clockval_sptr_t const & clockval, bool initial, bool final)
    : tchecker::zg::path::symbolic::node_t(s, initial, final), _clockval(clockval)
{
  if (_clockval->size() != s->zone().dim())
    throw std::invalid_argument("clock values and zone do not have the same size");

  if (!s->zone().belongs(*_clockval))
    throw std::invalid_argument("clock valuation does not belong to the zone");
}